

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O2

UriBool uriRemoveDotSegmentsExA
                  (UriUriA *uri,UriBool relative,UriBool pathOwned,UriMemoryManager *memory)

{
  UriPathSegmentA **ppUVar1;
  char cVar2;
  char *pcVar3;
  void *pvVar4;
  UriPathSegmentA *pUVar5;
  UriBool UVar6;
  UriPathSegmentA *pUVar7;
  int iVar8;
  UriPathSegmentA **ppUVar9;
  char *pcVar10;
  char *pcVar11;
  UriPathSegmentA *pUVar12;
  UriPathSegmentStructA *pUVar13;
  UriPathSegmentA *segment;
  
  if ((uri != (UriUriA *)0x0) && (pUVar12 = uri->pathHead, pUVar12 != (UriPathSegmentA *)0x0)) {
    ppUVar1 = &uri->pathHead;
    pUVar12->reserved = (void *)0x0;
    do {
      pcVar11 = (pUVar12->text).first;
      pcVar3 = (pUVar12->text).afterLast;
      iVar8 = (int)pcVar3 - (int)pcVar11;
      if (iVar8 == 2) {
        if ((*pcVar11 != '.') || (pcVar11[1] != '.')) goto LAB_001a2d3d;
        pUVar13 = pUVar12->next;
        pUVar5 = (UriPathSegmentA *)pUVar12->reserved;
        if (relative == 0) {
          if (pUVar5 == (UriPathSegmentA *)0x0) {
            if (pUVar13 == (UriPathSegmentStructA *)0x0) {
              if (uri->absolutePath == 0) {
                if ((pathOwned != 0) && (pcVar11 != pcVar3)) {
                  (*memory->free)(memory,pcVar11);
                }
                goto LAB_001a2f09;
              }
              *ppUVar1 = (UriPathSegmentA *)0x0;
              uri->pathTail = (UriPathSegmentA *)0x0;
            }
            else {
              *ppUVar1 = pUVar13;
              pUVar13->reserved = (void *)0x0;
            }
            goto LAB_001a2ccf;
          }
        }
        else if ((pUVar5 == (UriPathSegmentA *)0x0) ||
                (((pcVar10 = (pUVar5->text).first,
                  (long)(pUVar5->text).afterLast - (long)pcVar10 == 2 && (*pcVar10 == '.')) &&
                 (pcVar10[1] == '.')))) goto LAB_001a2d3d;
        pvVar4 = pUVar5->reserved;
        if (pvVar4 == (void *)0x0) {
          if (pUVar13 == (UriPathSegmentStructA *)0x0) {
            if ((pathOwned != 0) && (pcVar11 != pcVar3)) {
              (*memory->free)(memory,pcVar11);
            }
            (pUVar12->text).first = "X";
            (pUVar12->text).afterLast = "X";
            uri->pathHead = pUVar12;
            uri->pathTail = pUVar12;
          }
          else {
            *ppUVar1 = pUVar13;
            pUVar13->reserved = (void *)0x0;
            if ((pathOwned != 0) && (pcVar11 != pcVar3)) {
              (*memory->free)(memory,pcVar11);
            }
            (*memory->free)(memory,pUVar12);
          }
          pUVar12 = pUVar5;
          if ((pathOwned != 0) &&
             (pcVar11 = (pUVar5->text).first, pcVar11 != (pUVar5->text).afterLast)) {
LAB_001a2e8c:
            (*memory->free)(memory,pcVar11);
            pUVar12 = pUVar5;
          }
        }
        else {
          *(UriPathSegmentStructA **)((long)pvVar4 + 0x10) = pUVar13;
          if (pUVar12->next == (UriPathSegmentStructA *)0x0) {
            pUVar7 = (UriPathSegmentA *)(*memory->calloc)(memory,1,0x20);
            if (pUVar7 == (UriPathSegmentA *)0x0) {
              if (pathOwned != 0) {
                pcVar11 = (pUVar12->text).first;
                if (pcVar11 != (pUVar12->text).afterLast) {
                  (*memory->free)(memory,pcVar11);
                }
                (*memory->free)(memory,pUVar12);
                if ((pathOwned == 0) ||
                   (pUVar12 = (UriPathSegmentA *)(pUVar5->text).first,
                   pUVar12 == (UriPathSegmentA *)(pUVar5->text).afterLast)) goto LAB_001a2f80;
              }
              (*memory->free)(memory,pUVar12);
LAB_001a2f80:
              (*memory->free)(memory,pUVar5);
              return 0;
            }
            (pUVar7->text).first = "X";
            (pUVar7->text).afterLast = "X";
            *(UriPathSegmentA **)((long)pvVar4 + 0x10) = pUVar7;
            uri->pathTail = pUVar7;
          }
          else {
            pUVar12->next->reserved = pvVar4;
          }
          if (pathOwned == 0) {
            (*memory->free)(memory,pUVar12);
            pUVar12 = pUVar5;
          }
          else {
            pcVar11 = (pUVar12->text).first;
            if (pcVar11 != (pUVar12->text).afterLast) {
              (*memory->free)(memory,pcVar11);
            }
            (*memory->free)(memory,pUVar12);
            pcVar11 = (pUVar5->text).first;
            pUVar12 = pUVar5;
            if (pcVar11 != (pUVar5->text).afterLast) goto LAB_001a2e8c;
          }
        }
LAB_001a2e98:
        (*memory->free)(memory,pUVar12);
      }
      else {
        if ((iVar8 == 1) && (*pcVar11 == '.')) {
          pUVar13 = pUVar12->next;
          pvVar4 = pUVar12->reserved;
          if ((relative == 0) || (pUVar13 == (UriPathSegmentStructA *)0x0 || pUVar12 != *ppUVar1)) {
            if (pUVar13 == (UriPathSegmentStructA *)0x0) {
              if ((pathOwned != 0) && (pcVar11 != pcVar3)) {
                (*memory->free)(memory,pcVar11);
              }
              if ((pvVar4 == (void *)0x0) && (UVar6 = uriIsHostSetA(uri), UVar6 == 0)) {
                (*memory->free)(memory,pUVar12);
                *ppUVar1 = (UriPathSegmentA *)0x0;
                uri->pathTail = (UriPathSegmentA *)0x0;
                return 1;
              }
LAB_001a2f09:
              (pUVar12->text).first = "X";
              (pUVar12->text).afterLast = "X";
              return 1;
            }
LAB_001a2cbb:
            ppUVar9 = (UriPathSegmentA **)((long)pvVar4 + 0x10);
            if (pvVar4 == (void *)0x0) {
              ppUVar9 = ppUVar1;
            }
            pUVar13->reserved = pvVar4;
            *ppUVar9 = pUVar13;
LAB_001a2ccf:
            if ((pathOwned != 0) && (pcVar11 != pcVar3)) {
              (*memory->free)(memory,pcVar11);
            }
            goto LAB_001a2e98;
          }
          pcVar10 = (pUVar13->text).first;
          do {
            if ((pUVar13->text).afterLast <= pcVar10) goto LAB_001a2cbb;
            cVar2 = *pcVar10;
            pcVar10 = pcVar10 + 1;
          } while (cVar2 != ':');
        }
LAB_001a2d3d:
        pUVar13 = pUVar12->next;
        if (pUVar13 == (UriPathSegmentStructA *)0x0) {
          uri->pathTail = pUVar12;
          return 1;
        }
        pUVar13->reserved = pUVar12;
      }
      pUVar12 = pUVar13;
    } while (pUVar13 != (UriPathSegmentStructA *)0x0);
  }
  return 1;
}

Assistant:

UriBool URI_FUNC(RemoveDotSegmentsEx)(URI_TYPE(Uri) * uri,
		UriBool relative, UriBool pathOwned, UriMemoryManager * memory) {
	URI_TYPE(PathSegment) * walker;
	if ((uri == NULL) || (uri->pathHead == NULL)) {
		return URI_TRUE;
	}

	walker = uri->pathHead;
	walker->reserved = NULL; /* Prev pointer */
	do {
		UriBool removeSegment = URI_FALSE;
		int len = (int)(walker->text.afterLast - walker->text.first);
		switch (len) {
		case 1:
			if ((walker->text.first)[0] == _UT('.')) {
				/* "." segment -> remove if not essential */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				/*
				 * Is this dot segment essential,
				 * i.e. is there a chance of changing semantics by dropping this dot segment?
				 *
				 * For example, changing "./http://foo" into "http://foo" would change semantics
				 * and hence the dot segment is essential to that case and cannot be removed.
				 */
				removeSegment = URI_TRUE;
				if (relative && (walker == uri->pathHead) && (walker->next != NULL)) {
					const URI_CHAR * ch = walker->next->text.first;
					for (; ch < walker->next->text.afterLast; ch++) {
						if (*ch == _UT(':')) {
							removeSegment = URI_FALSE;
							break;
						}
					}
				}

				if (removeSegment) {
					/* .. then let's go remove that segment. */
					/* Last segment? */
					if (walker->next != NULL) {
						/* Not last segment, i.e. first or middle segment
						 * OLD: (prev|NULL) <- walker <- next
						 * NEW: (prev|NULL) <----------- next */
						walker->next->reserved = prev;

						if (prev == NULL) {
							/* First but not last segment
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;
						} else {
							/* Middle segment
							 * OLD: prev -> walker -> next
							 * NEW: prev -----------> next */
							prev->next = walker->next;
						}

						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}
						memory->free(memory, walker);
					} else {
						/* Last segment */
						if (pathOwned && (walker->text.first != walker->text.afterLast)) {
							memory->free(memory, (URI_CHAR *)walker->text.first);
						}

						if (prev == NULL) {
							/* Last and first */
							if (URI_FUNC(IsHostSet)(uri)) {
								/* Replace "." with empty segment to represent trailing slash */
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
							} else {
								memory->free(memory, walker);

								uri->pathHead = NULL;
								uri->pathTail = NULL;
							}
						} else {
							/* Last but not first, replace "." with empty segment to represent trailing slash */
							walker->text.first = URI_FUNC(SafeToPointTo);
							walker->text.afterLast = URI_FUNC(SafeToPointTo);
						}
					}

					walker = nextBackup;
				}
			}
			break;

		case 2:
			if (((walker->text.first)[0] == _UT('.'))
					&& ((walker->text.first)[1] == _UT('.'))) {
				/* Path ".." -> remove this and the previous segment */
				URI_TYPE(PathSegment) * const prev = walker->reserved;
				URI_TYPE(PathSegment) * prevPrev;
				URI_TYPE(PathSegment) * const nextBackup = walker->next;

				removeSegment = URI_TRUE;
				if (relative) {
					if (prev == NULL) {
						/* We cannot remove traversal beyond because the
						 * URI is relative and may be resolved later.
						 * So we can simplify "a/../b/d" to "b/d" but
						 * we cannot simplify "../b/d" (outside of reference resolution). */
						removeSegment = URI_FALSE;
					} else if ((prev != NULL)
							&& ((prev->text.afterLast - prev->text.first) == 2)
							&& ((prev->text.first)[0] == _UT('.'))
							&& ((prev->text.first)[1] == _UT('.'))) {
						/* We need to protect against mis-simplifying "a/../../b" to "a/b". */
						removeSegment = URI_FALSE;
					}
				}

				if (removeSegment) {
					if (prev != NULL) {
						/* Not first segment */
						prevPrev = prev->reserved;
						if (prevPrev != NULL) {
							/* Not even prev is the first one
							 * OLD: prevPrev -> prev -> walker -> (next|NULL)
							 * NEW: prevPrev -------------------> (next|NULL) */
							prevPrev->next = walker->next;
							if (walker->next != NULL) {
								/* Update parent relationship as well
								 * OLD: prevPrev <- prev <- walker <- next
								 * NEW: prevPrev <------------------- next */
								walker->next->reserved = prevPrev;
							} else {
								/* Last segment -> insert "" segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = memory->calloc(memory, 1, sizeof(URI_TYPE(PathSegment)));
								if (segment == NULL) {
									if (pathOwned && (walker->text.first != walker->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)walker->text.first);
									}
									memory->free(memory, walker);

									if (pathOwned && (prev->text.first != prev->text.afterLast)) {
										memory->free(memory, (URI_CHAR *)prev->text.first);
									}
									memory->free(memory, prev);

									return URI_FALSE; /* Raises malloc error */
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								prevPrev->next = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						} else {
							/* Prev is the first segment */
							if (walker->next != NULL) {
								uri->pathHead = walker->next;
								walker->next->reserved = NULL;

								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								memory->free(memory, walker);
							} else {
								/* Re-use segment for "" path segment to represent trailing slash, update tail */
								URI_TYPE(PathSegment) * const segment = walker;
								if (pathOwned && (segment->text.first != segment->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)segment->text.first);
								}
								segment->text.first = URI_FUNC(SafeToPointTo);
								segment->text.afterLast = URI_FUNC(SafeToPointTo);
								uri->pathHead = segment;
								uri->pathTail = segment;
							}

							if (pathOwned && (prev->text.first != prev->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)prev->text.first);
							}
							memory->free(memory, prev);

							walker = nextBackup;
						}
					} else {
						URI_TYPE(PathSegment) * const anotherNextBackup = walker->next;
						int freeWalker = URI_TRUE;

						/* First segment */
						if (walker->next != NULL) {
							/* First segment of multiple -> update head
							 * OLD: head -> walker -> next
							 * NEW: head -----------> next */
							uri->pathHead = walker->next;

							/* Update parent link as well
							 * OLD: head <- walker <- next
							 * NEW: head <----------- next */
							walker->next->reserved = NULL;
						} else {
							if (uri->absolutePath) {
								/* First and only segment -> update head
								 * OLD: head -> walker -> NULL
								 * NEW: head -----------> NULL */
								uri->pathHead = NULL;

								/* Last segment -> update tail
								 * OLD: tail -> walker
								 * NEW: tail -> NULL */
								uri->pathTail = NULL;
							} else {
								/* Re-use segment for "" path segment to represent trailing slash,
								 * then update head and tail */
								if (pathOwned && (walker->text.first != walker->text.afterLast)) {
									memory->free(memory, (URI_CHAR *)walker->text.first);
								}
								walker->text.first = URI_FUNC(SafeToPointTo);
								walker->text.afterLast = URI_FUNC(SafeToPointTo);
								freeWalker = URI_FALSE;
							}
						}

						if (freeWalker) {
							if (pathOwned && (walker->text.first != walker->text.afterLast)) {
								memory->free(memory, (URI_CHAR *)walker->text.first);
							}
							memory->free(memory, walker);
						}

						walker = anotherNextBackup;
					}
				}
			}
			break;
		} /* end of switch */

		if (!removeSegment) {
			/* .. then let's move to the next element, and start again. */
			if (walker->next != NULL) {
				walker->next->reserved = walker;
			} else {
				/* Last segment -> update tail */
				uri->pathTail = walker;
			}
			walker = walker->next;
		}
	} while (walker != NULL);

	return URI_TRUE;
}